

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_internal.c
# Opt level: O0

void stretch_image(uint32_t *srcImage,uint32_t srcX,uint32_t srcY,uint32_t srcWidth,
                  uint32_t srcHeight,uint32_t srcPitch,uint32_t *dstImage,uint32_t dstX,
                  uint32_t dstY,uint32_t dstWidth,uint32_t dstHeight,uint32_t dstPitch)

{
  uint32_t deltaY;
  uint32_t deltaX;
  uint32_t srcOffsetY;
  uint32_t srcOffsetX;
  uint32_t y;
  uint32_t x;
  uint32_t srcPitch_local;
  uint32_t srcHeight_local;
  uint32_t srcWidth_local;
  uint32_t srcY_local;
  uint32_t srcX_local;
  uint32_t *srcImage_local;
  
  if ((srcImage != (uint32_t *)0x0) && (dstImage != (uint32_t *)0x0)) {
    srcImage_local = srcImage + (srcX + srcY * srcPitch);
    dstImage = dstImage + (dstX + dstY * dstPitch);
    srcOffsetY = 0;
    for (y = 0; y < dstHeight; y = y + 1) {
      srcOffsetX = 0;
      for (x = 0; x < dstWidth; x = x + 1) {
        dstImage[x] = srcImage_local[srcOffsetX >> 0x10];
        srcOffsetX = (srcWidth << 0x10) / dstWidth + srcOffsetX;
      }
      srcOffsetY = (srcHeight << 0x10) / dstHeight + srcOffsetY;
      if (0xffff < srcOffsetY) {
        srcImage_local = srcImage_local + (srcOffsetY >> 0x10) * srcPitch;
        srcOffsetY = srcOffsetY & 0xffff;
      }
      dstImage = dstImage + dstPitch;
    }
  }
  return;
}

Assistant:

void
stretch_image(uint32_t *srcImage, uint32_t srcX, uint32_t srcY, uint32_t srcWidth, uint32_t srcHeight, uint32_t srcPitch,
              uint32_t *dstImage, uint32_t dstX, uint32_t dstY, uint32_t dstWidth, uint32_t dstHeight, uint32_t dstPitch) {

    uint32_t    x, y;
    uint32_t    srcOffsetX, srcOffsetY;

    if(srcImage == 0x0 || dstImage == 0x0)
        return;

    srcImage += srcX + srcY * srcPitch;
    dstImage += dstX + dstY * dstPitch;

    const uint32_t deltaX = (srcWidth  << 16) / dstWidth;
    const uint32_t deltaY = (srcHeight << 16) / dstHeight;

    srcOffsetY = 0;
    for(y=0; y<dstHeight; ++y) {
        srcOffsetX = 0;
        for(x=0; x<dstWidth; ++x) {
#if defined(kUseBilinearInterpolation)
            dstImage[x] = interpolate(srcImage, x+srcX, y+srcY, srcOffsetX, srcOffsetY, srcWidth, srcHeight, srcPitch);
#else
            dstImage[x] = srcImage[srcOffsetX >> 16];
#endif
            srcOffsetX += deltaX;
        }

        srcOffsetY += deltaY;
        if(srcOffsetY >= 0x10000) {
            srcImage += (srcOffsetY >> 16) * srcPitch;
            srcOffsetY &= 0xffff;
        }
        dstImage += dstPitch;
    }
}